

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.c
# Opt level: O2

ErrorNumber
doRangeTestFixSize(RangeTestFunction testFunction,void *opaqueData,TA_Integer refOutBeg,
                  TA_Integer refOutNbElement,TA_Integer refLookback,TA_Real *refBuffer,
                  TA_Integer *refBufferInt,TA_FuncUnstId unstId,TA_Integer fixSize,uint outputNb,
                  uint integerTolerance)

{
  TA_RetCode TVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  ErrorNumber EVar5;
  double *__ptr;
  undefined4 *__ptr_00;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  char *pcVar10;
  undefined4 in_register_00000084;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  TA_Integer outputNbElement;
  uint local_fc;
  uint local_f8;
  TA_Integer outputBegIdx;
  double local_f0;
  double local_e8;
  double local_e0;
  ulong local_d8;
  uint local_d0;
  TA_Integer lookback;
  ulong local_c8;
  int local_c0;
  uint outputIsInteger;
  double local_b8;
  undefined8 uStack_b0;
  TA_Real *local_a0;
  TA_Integer *local_98;
  uint local_90;
  uint local_8c;
  int local_88;
  TA_FuncUnstId local_84;
  long local_80;
  RangeTestFunction local_78;
  void *local_70;
  long local_68;
  TA_Real *local_60;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  
  local_68 = CONCAT44(in_register_00000084,refLookback);
  uVar11 = (ulong)unstId;
  local_fc = refOutBeg;
  local_78 = testFunction;
  local_70 = opaqueData;
  local_60 = refBuffer;
  __ptr = (double *)malloc(uVar11 * 8 + 0x10);
  if (__ptr == (double *)0x0) {
    EVar5 = TA_TESTUTIL_DRT_ALLOC_ERR;
  }
  else {
    __ptr_00 = (undefined4 *)malloc((uVar11 + 2) * 4);
    *__ptr = 9.1349043e-200;
    lVar7 = (long)unstId;
    local_80 = lVar7 + 1;
    __ptr[lVar7 + 1] = 8.1489031e-158;
    *__ptr_00 = 0x80000000;
    __ptr_00[lVar7 + 1] = 0x80000000;
    uVar6 = 0;
    uVar8 = 0;
    if (TA_FUNC_UNST_ADX < unstId) {
      uVar8 = (ulong)(uint)unstId;
    }
    for (; uVar8 != uVar6; uVar6 = uVar6 + 1) {
      __ptr[uVar6 + 1] = -2.849284e-199;
      __ptr_00[uVar6 + 1] = 0x80000000;
    }
    local_c0 = 0xfc - unstId;
    local_84 = refOutNbElement;
    if (unstId < refOutNbElement) {
      local_84 = unstId;
    }
    local_a0 = __ptr + 1;
    local_98 = __ptr_00 + 1;
    local_e0 = *(double *)
                (&DAT_00181930 + (ulong)((TA_FuncUnstId)refBufferInt == TA_FUNC_UNST_T3) * 8);
    local_90 = outputNb * 2;
    local_8c = outputNb * 3;
    uVar6 = 0;
    local_d8 = uVar11;
    local_d0 = refOutNbElement;
    while (iVar2 = (int)uVar6, iVar2 <= local_c0) {
      local_f8 = (unstId + iVar2) - 1;
      TVar1 = CallTestFunction(local_78,iVar2,local_f8,local_a0,local_98,&outputBegIdx,
                               &outputNbElement,&lookback,local_70,fixSize,&outputIsInteger);
      if (TVar1 != TA_SUCCESS) {
        printf("Fail: doRangeTestFixSize testFunction return error=(%d) (%d,%d)\n",(ulong)TVar1,
               (ulong)(uint)unstId,uVar6);
        free(__ptr);
        free(__ptr_00);
        return TA_TESTUTIL_DRT_RETCODE_ERR;
      }
      if (outputNbElement != 0) {
        iVar12 = outputBegIdx - local_fc;
        if (((outputBegIdx < (int)local_fc) || (outputBegIdx < iVar2)) ||
           (local_88 = (int)local_d8 + iVar2, local_88 <= outputBegIdx)) {
          puts("Fail: doRangeTestFixSize bad outBegIdx");
          printf("Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n",uVar6,(ulong)local_f8,
                 (ulong)(uint)outputBegIdx,(ulong)(uint)outputNbElement,local_d8);
          printf("Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n",(ulong)local_fc,
                 (ulong)(uint)refOutNbElement);
          free(__ptr);
          free(__ptr_00);
          return TA_TESTUTIL_DRT_BAD_OUTBEGIDX;
        }
        local_c8 = uVar6;
        if (local_84 < outputNbElement) {
          puts("Fail: doRangeTestFixSize Incorrect outputNbElement");
          printf("Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n",local_c8,(ulong)local_f8,
                 (ulong)(uint)outputBegIdx,(ulong)(uint)outputNbElement,local_d8);
          printf("Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n",(ulong)local_fc,
                 (ulong)(uint)refOutNbElement);
          free(__ptr);
          return TA_TESTUTIL_DRT_BAD_OUTNBLEMENT;
        }
        if (outputBegIdx < lookback) {
          printf("Fail: doRangeTestFixSize Lookback calculation too high? (%d)\n");
          printf("Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n",local_c8,(ulong)local_f8,
                 (ulong)(uint)outputBegIdx,(ulong)(uint)outputNbElement,local_d8);
          printf("Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n",(ulong)local_fc,
                 (ulong)(uint)refOutNbElement);
          free(__ptr);
          free(__ptr_00);
          return TA_TESTUTIL_DRT_LOOKBACK_TOO_HIGH;
        }
        uVar13 = 0;
        goto LAB_0011cc54;
      }
      if ((lookback < iVar2) || (lookback < (int)local_f8)) {
        printf("Fail: doRangeTestFixSize data missing (%d,%d,%d)\n",uVar6);
        free(__ptr);
        free(__ptr_00);
        return TA_TESTUTIL_DRT_MISSING_DATA;
      }
      if (iVar2 + 100 <= local_c0 && 0x1e < iVar2) {
        iVar12 = rand();
        iVar2 = iVar2 + iVar12 % 100 + 0x28;
      }
      uVar6 = (ulong)(iVar2 + 1);
    }
    free(__ptr);
    free(__ptr_00);
    EVar5 = TA_TEST_PASS;
  }
  return EVar5;
LAB_0011cc54:
  uVar6 = local_c8;
  uVar3 = local_d0;
  uVar11 = local_d8;
  if (outputNbElement <= (int)uVar13) {
    if (lookback <= (int)local_c8) {
      lookback = (int)local_c8;
    }
    iVar2 = local_88 - lookback;
    if (local_88 - lookback == 0 || local_88 < lookback) {
      iVar2 = 0;
    }
    if (outputNbElement == (int)local_d8) {
      if ((*__ptr != 9.1349043e-200) || (NAN(*__ptr))) {
        printf("Fail: doRangeTestFixSize bad RESV_PATTERN_PREFIX (%e)\n");
      }
      else {
        printf("Fail: doRangeTestFixSize bad RESV_PATTERN_PREFIX_INT (%d)\n");
      }
      printf("Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n",uVar6 & 0xffffffff,(ulong)local_f8,
             (ulong)(uint)outputBegIdx,(ulong)(uint)outputNbElement,uVar11 & 0xffffffff);
      printf("Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n",(ulong)local_fc,
             (ulong)uVar3);
      free(__ptr);
      free(__ptr_00);
      return TA_TESTUTIL_DRT_BAD_PREFIX;
    }
    if ((local_a0[iVar2] == -2.849284e-199) && (!NAN(local_a0[iVar2]))) {
      printf("Fail: doRangeTestFixSize out-of-bound output  (%d)\n");
      printf("Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n",uVar6 & 0xffffffff,(ulong)local_f8,
             (ulong)(uint)outputBegIdx,(ulong)(uint)outputNbElement,uVar11 & 0xffffffff);
      printf("Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n",(ulong)local_fc,
             (ulong)uVar3);
      free(__ptr);
      free(__ptr_00);
      return TA_TESTUTIL_DRT_OUT_OF_BOUND_OUT_INT;
    }
    printf("Fail: doRangeTestFixSize out-of-bound output (%e)\n");
    printf("Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n",uVar6 & 0xffffffff,(ulong)local_f8,
           (ulong)(uint)outputBegIdx,(ulong)(uint)outputNbElement,uVar11 & 0xffffffff);
    printf("Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n",(ulong)local_fc,
           (ulong)uVar3);
    free(__ptr);
    free(__ptr_00);
    return TA_TESTUTIL_DRT_OUT_OF_BOUND_OUT;
  }
  lVar7 = (long)(int)(uVar13 + iVar12);
  if (outputIsInteger == 0) {
    if (outputNb != 0xffffffff) {
      dVar16 = local_a0[(int)uVar13];
      dVar15 = *(double *)(local_68 + lVar7 * 8);
      if ((TA_FuncUnstId)refBufferInt == TA_FUNC_UNST_NONE) {
        if ((dVar16 <= dVar15 + -1e-09) || (dVar15 + 1e-09 <= dVar16)) goto LAB_0011d59c;
      }
      else if ((1e-05 <= dVar16) || (1e-05 <= dVar15)) {
        local_f0 = dVar15;
        local_e8 = dVar16;
        if (outputNb == 0) {
          uVar3 = TA_GetUnstablePeriod((TA_FuncUnstId)refBufferInt);
          dVar16 = (double)(uVar3 + uVar13 + 1);
          if ((local_e0 < dVar16) &&
             (0.5 / (dVar16 - local_e0) <
              (double)(~-(ulong)(local_f0 < local_e8) & (ulong)((local_f0 - local_e8) / local_f0) |
                      (ulong)((local_e8 - local_f0) / local_e8) & -(ulong)(local_f0 < local_e8)))) {
            printf("\nFail: Value out of tolerance range (%g,%g)\n");
            dVar15 = local_f0;
            dVar16 = local_e8;
            goto LAB_0011d59c;
          }
        }
        else {
          dVar17 = dVar16 - dVar15;
          dVar18 = dVar15 - dVar16;
          dVar14 = (double)-(ulong)(dVar15 < dVar16);
          if (outputNb == 10) {
            local_b8 = (double)(~(ulong)dVar14 & (ulong)dVar18 | (ulong)dVar17 & (ulong)dVar14) *
                       10.0;
            uStack_b0 = 0;
            uVar3 = TA_GetUnstablePeriod((TA_FuncUnstId)refBufferInt);
            if ((local_e0 < (double)(uVar3 + uVar13 + 1)) && (1 < (int)local_b8)) {
              pcVar10 = "\nFail: Value diffferent by more than 1/10 (%f)\n";
LAB_0011d583:
              printf(pcVar10,local_b8);
              dVar15 = local_f0;
              dVar16 = local_e8;
LAB_0011d59c:
              local_f0 = dVar15;
              local_e8 = dVar16;
              printf("Fail: doRangeTestFixSize diff data for idx=%d (%e,%e)\n",dVar16,(ulong)uVar13)
              ;
              printf("Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n",local_c8,(ulong)local_f8,
                     (ulong)(uint)outputBegIdx,(ulong)(uint)outputNbElement,local_d8);
              printf("Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n",(ulong)local_fc,
                     (ulong)local_d0);
              if ((local_e8 != 0.0) || (NAN(local_e8))) {
                printf("Fail: Diff %g %%\n",((local_f0 - local_e8) / local_e8) * 100.0);
              }
              free(__ptr);
              free(__ptr_00);
              return TA_TESTUTIL_DRT_DATA_DIFF;
            }
          }
          else if (outputNb == 100) {
            local_b8 = (double)(~(ulong)dVar14 & (ulong)dVar18 | (ulong)dVar17 & (ulong)dVar14) *
                       100.0;
            uStack_b0 = 0;
            uVar3 = TA_GetUnstablePeriod((TA_FuncUnstId)refBufferInt);
            if ((local_e0 < (double)(uVar3 + uVar13 + 1)) && (1 < (int)local_b8)) {
              pcVar10 = "\nFail: Value diffferent by more than 1/100 (%f)\n";
              goto LAB_0011d583;
            }
          }
          else if (outputNb == 0x168) {
            uStack_50 = 0;
            uStack_40 = 0;
            uStack_b0 = 0;
            local_b8 = dVar14;
            local_58 = dVar18;
            local_48 = dVar17;
            uVar3 = TA_GetUnstablePeriod((TA_FuncUnstId)refBufferInt);
            if (local_e0 < (double)(uVar3 + uVar13 + 1)) {
              uVar9 = (uint)(long)local_f0;
              uVar4 = (uint)(long)local_e8;
              uVar3 = uVar9 - uVar4;
              if (uVar9 < uVar4) {
                uVar3 = -(uVar9 - uVar4);
              }
              uVar11 = (ulong)uVar3;
              if ((1 < uVar3) &&
                 (0.1 < (double)(~(ulong)local_b8 & (ulong)(local_58 / local_f0) |
                                (ulong)(local_48 / local_e8) & (ulong)local_b8))) {
                pcVar10 = "\nFail: Value diffferent by more than 10 percent over 1 degree (%d)\n";
LAB_0011d64f:
                printf(pcVar10,uVar11);
                dVar15 = local_f0;
                dVar16 = local_e8;
                goto LAB_0011d59c;
              }
            }
          }
          else if (outputNb == 1000) {
            local_b8 = (double)(~(ulong)dVar14 & (ulong)dVar18 | (ulong)dVar17 & (ulong)dVar14) *
                       1000.0;
            uStack_b0 = 0;
            uVar3 = TA_GetUnstablePeriod((TA_FuncUnstId)refBufferInt);
            if ((local_e0 < (double)(uVar3 + uVar13 + 1)) && (1 < (int)local_b8)) {
              pcVar10 = "\nFail: Value diffferent by more than 1/1000 (%f)\n";
              goto LAB_0011d583;
            }
          }
          else {
            uVar9 = (uint)(long)dVar15;
            uVar4 = (uint)(long)dVar16;
            uVar3 = uVar9 - uVar4;
            if (uVar9 < uVar4) {
              uVar3 = -(uVar9 - uVar4);
            }
            uVar11 = (ulong)uVar3;
            uVar4 = TA_GetUnstablePeriod((TA_FuncUnstId)refBufferInt);
            uVar4 = uVar4 + uVar13 + 1;
            if (local_e0 < (double)uVar4) {
              if (uVar4 < 100) {
                if (local_8c <= uVar3) {
                  pcVar10 = "\nFail: Value out of 3*tolerance range (%d,%d)\n";
LAB_0011d687:
                  printf(pcVar10,uVar11,(ulong)outputNb);
                  dVar15 = local_f0;
                  dVar16 = local_e8;
                  goto LAB_0011d59c;
                }
              }
              else if (uVar4 < 0x96) {
                if (local_90 <= uVar3) {
                  pcVar10 = "\nFail: Value out of 2*tolerance range (%d,%d)\n";
                  goto LAB_0011d687;
                }
              }
              else if (uVar4 < 200) {
                if (outputNb <= uVar3) {
                  pcVar10 = "\nFail: Value out of tolerance range (%d,%d)\n";
                  goto LAB_0011d687;
                }
              }
              else if (uVar3 != 0) {
                pcVar10 = "\nFail: Value not equal (difference is %d)\n";
                goto LAB_0011d64f;
              }
            }
          }
        }
      }
    }
  }
  else if (local_98[(int)uVar13] != *(int *)((long)local_60 + lVar7 * 4)) {
    printf("Fail: doRangeTestFixSize diff data for idx=%d (%d,%d)\n",(ulong)uVar13);
    printf("Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n",local_c8,(ulong)local_f8,
           (ulong)(uint)outputBegIdx,(ulong)(uint)outputNbElement,local_d8);
    printf("Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n",(ulong)local_fc,
           (ulong)local_d0);
    free(__ptr);
    free(__ptr_00);
    return TA_TESTUTIL_DRT_DATA_DIFF_INT;
  }
  if ((0x1e < outputNbElement) &&
     (uVar3 = outputNbElement - 0x14, (int)uVar13 < (int)uVar3 && 0x14 < (int)uVar13)) {
    iVar2 = rand();
    uVar13 = iVar2 % 200 + uVar13;
    if ((int)uVar3 <= (int)uVar13) {
      uVar13 = uVar3;
    }
  }
  uVar13 = uVar13 + 1;
  goto LAB_0011cc54;
}

Assistant:

static ErrorNumber doRangeTestFixSize( RangeTestFunction testFunction,
                                       void *opaqueData,
                                       TA_Integer refOutBeg,
                                       TA_Integer refOutNbElement,
                                       TA_Integer refLookback,
                                       const TA_Real *refBuffer,
                                       const TA_Integer *refBufferInt,
                                       TA_FuncUnstId unstId,
                                       TA_Integer fixSize,
                                       unsigned int outputNb,
                                       unsigned int integerTolerance )
{
   TA_RetCode retCode;
   TA_Real *outputBuffer;
   TA_Real val1, val2;
   TA_Integer i, temp;
   TA_Integer outputBegIdx, outputNbElement, lookback;
   TA_Integer startIdx, endIdx, relativeIdx, outputSizeByOptimalLogic;
   TA_Integer *outputBufferInt;
   unsigned int outputIsInteger;

   (void)refLookback;

   /* Allocate the output buffer (+prefix and suffix memory guard). */
   outputBuffer = (TA_Real *)TA_Malloc( (fixSize+2) * sizeof( TA_Real ) );

   if( !outputBuffer )
      return TA_TESTUTIL_DRT_ALLOC_ERR;

   outputBufferInt = (TA_Integer *)TA_Malloc( (fixSize+2) * sizeof( TA_Integer ) );

   if( !refBufferInt )
   {
      TA_Free( outputBuffer );
      return TA_TESTUTIL_DRT_ALLOC_ERR;
   }

   outputBuffer[0] = RESV_PATTERN_PREFIX;
   outputBuffer[fixSize+1] = RESV_PATTERN_SUFFIX;

   outputBufferInt[0] = RESV_PATTERN_PREFIX_INT;
   outputBufferInt[fixSize+1] = RESV_PATTERN_SUFFIX_INT;

   /* Initialize the outputs with improbable values. */
   for( i=1; i <= fixSize; i++ )
   {
      outputBuffer[i] = RESV_PATTERN_IMPROBABLE;
      outputBufferInt[i] = RESV_PATTERN_IMPROBABLE_INT;
   }

   /* Test for a large number of possible startIdx */
   for( startIdx=0; startIdx <= (MAX_RANGE_SIZE-fixSize); startIdx++ )
   {
      /* Call the TA function. */
      endIdx = startIdx+fixSize-1;
      retCode = CallTestFunction( testFunction, startIdx, endIdx,
                              &outputBuffer[1], &outputBufferInt[1],
                              &outputBegIdx, &outputNbElement, &lookback,
                              opaqueData, outputNb, &outputIsInteger );

      if( retCode != TA_SUCCESS )
      {
          /* No call shall never fail here. When the range
           * is "out-of-range" the function shall still return
           * TA_SUCCESS with the outNbElement equal to zero.
           */
         printf( "Fail: doRangeTestFixSize testFunction return error=(%d) (%d,%d)\n", retCode, fixSize, startIdx );
         TA_Free( outputBuffer );
         TA_Free( outputBufferInt );
         return TA_TESTUTIL_DRT_RETCODE_ERR;
      }
      else
      {
         /* Possible startIdx gap of the output shall be always the
          * same regardless of the range.
          */
         if( outputNbElement == 0 )
         {
            /* Trap cases where there is no output. */
            if( (startIdx > lookback) || (endIdx > lookback) )
            {
               /* Whenever startIdx is greater than lookback, some data
                * shall be return. Same idea with endIdx.
                *
                * Note:
                *  some output will never start at the startIdx, particularly
                *  when a TA function have multiple output. Usually, the first output
                *  will be between startIdx/endIdx and other outputs may have a "gap"
                *  from the startIdx.
                *
                * Example:
                *    Stochastic %K is between startIdx/endIdx, but %D output will
                *    have less data because it is a MA of %K. A gap will then
                *    exist for the %D output.
                */
               printf( "Fail: doRangeTestFixSize data missing (%d,%d,%d)\n", startIdx, endIdx, lookback );

               TA_Free( outputBuffer );
               TA_Free( outputBufferInt );
               return TA_TESTUTIL_DRT_MISSING_DATA;
            }
         }
         else
         {
            /* Some output was returned. Are the returned index correct? */
            if( (outputBegIdx < startIdx) || (outputBegIdx > endIdx) || (outputBegIdx < refOutBeg))
            {
               printf( "Fail: doRangeTestFixSize bad outBegIdx\n" );
               printf( "Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n", startIdx, endIdx, outputBegIdx, outputNbElement, fixSize );
               printf( "Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n", refOutBeg, refOutNbElement );
               TA_Free( outputBuffer );
               TA_Free( outputBufferInt );
               return TA_TESTUTIL_DRT_BAD_OUTBEGIDX;
            }

            if( (outputNbElement > fixSize) || (outputNbElement > refOutNbElement) )
            {
               printf( "Fail: doRangeTestFixSize Incorrect outputNbElement\n" );
               printf( "Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n", startIdx, endIdx, outputBegIdx, outputNbElement, fixSize );
               printf( "Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n", refOutBeg, refOutNbElement );
               TA_Free(  outputBuffer );
               return TA_TESTUTIL_DRT_BAD_OUTNBLEMENT;
            }

            /* Is the calculated lookback too high? */
            if( outputBegIdx < lookback )
            {
               printf( "Fail: doRangeTestFixSize Lookback calculation too high? (%d)\n", lookback );
               printf( "Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n", startIdx, endIdx, outputBegIdx, outputNbElement, fixSize );
               printf( "Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n", refOutBeg, refOutNbElement );
               TA_Free( outputBuffer );
               TA_Free( outputBufferInt );
               return TA_TESTUTIL_DRT_LOOKBACK_TOO_HIGH;
            }

            /* Is the output identical to the reference? */
            relativeIdx = outputBegIdx-refOutBeg;
            for( i=0; i < outputNbElement; i++ )
            {
               if( outputIsInteger )
               {
                  if( outputBufferInt[1+i] != refBufferInt[relativeIdx+i] )
                  {
                     printf( "Fail: doRangeTestFixSize diff data for idx=%d (%d,%d)\n", i,
                              outputBufferInt[1+i], refBufferInt[relativeIdx+i] );
                     printf( "Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n", startIdx, endIdx, outputBegIdx, outputNbElement, fixSize );
                     printf( "Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n", refOutBeg, refOutNbElement );
                     TA_Free( outputBuffer );
                     TA_Free( outputBufferInt );
                     return TA_TESTUTIL_DRT_DATA_DIFF_INT;
                  }
               }
               else
               {
                  val1 = outputBuffer[1+i];
                  val2 = refBuffer[relativeIdx+i];
                  if( !dataWithinReasonableRange( val1, val2, i, unstId, integerTolerance ) )
                  {
                     printf( "Fail: doRangeTestFixSize diff data for idx=%d (%e,%e)\n", i, val1, val2 );
                     printf( "Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n", startIdx, endIdx, outputBegIdx, outputNbElement, fixSize );
                     printf( "Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n", refOutBeg, refOutNbElement );
                     if( val1 != 0.0 )
                        printf( "Fail: Diff %g %%\n", ((val2-val1)/val1)*100.0 );
                     TA_Free( outputBuffer );
                     TA_Free( outputBufferInt );
                     return TA_TESTUTIL_DRT_DATA_DIFF;
                  }
               }

               /* Randomly skip the verification of some value. Limit
                * cases are always checked though.
                */
               if( outputNbElement > 30 )
               {
                  temp = outputNbElement-20;
                  if( (i > 20) && (i < temp) )
                  {
                     /* Randomly skips from 0 to 200 verification.
                      * Never make it skip the last 20 values.
                      */
                     i += (rand() % 200);
                     if( i > temp )
                        i = temp;
                  }
               }
            }

            /* Verify out-of-bound writing in the output buffer. */
            outputSizeByOptimalLogic = max(lookback,startIdx);
            if( outputSizeByOptimalLogic > endIdx )
               outputSizeByOptimalLogic = 0;
            else
               outputSizeByOptimalLogic = endIdx-outputSizeByOptimalLogic+1;

            if( (fixSize != outputNbElement) && (outputBuffer[1+outputSizeByOptimalLogic] != RESV_PATTERN_IMPROBABLE) )
            {
               printf( "Fail: doRangeTestFixSize out-of-bound output (%e)\n", outputBuffer[1+outputSizeByOptimalLogic] );
               printf( "Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n", startIdx, endIdx, outputBegIdx, outputNbElement, fixSize );
               printf( "Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n", refOutBeg, refOutNbElement );
               TA_Free( outputBuffer );
               TA_Free( outputBufferInt );
               return TA_TESTUTIL_DRT_OUT_OF_BOUND_OUT;
            }

            if( (fixSize != outputNbElement) && (outputBufferInt[1+outputSizeByOptimalLogic] != RESV_PATTERN_IMPROBABLE_INT) )
            {
               printf( "Fail: doRangeTestFixSize out-of-bound output  (%d)\n", outputBufferInt[1+outputSizeByOptimalLogic] );
               printf( "Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n", startIdx, endIdx, outputBegIdx, outputNbElement, fixSize );
               printf( "Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n", refOutBeg, refOutNbElement );
               TA_Free( outputBuffer );
               TA_Free( outputBufferInt );
               return TA_TESTUTIL_DRT_OUT_OF_BOUND_OUT_INT;
            }

            /* Verify that the memory guard were preserved. */
            if( outputBuffer[0] != RESV_PATTERN_PREFIX )
            {
               printf( "Fail: doRangeTestFixSize bad RESV_PATTERN_PREFIX (%e)\n", outputBuffer[0] );
               printf( "Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n", startIdx, endIdx, outputBegIdx, outputNbElement, fixSize );
               printf( "Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n", refOutBeg, refOutNbElement );
               TA_Free( outputBuffer );
               TA_Free( outputBufferInt );
               return TA_TESTUTIL_DRT_BAD_PREFIX;
            }

            if( outputBufferInt[0] != RESV_PATTERN_PREFIX_INT )
            {
               printf( "Fail: doRangeTestFixSize bad RESV_PATTERN_PREFIX_INT (%d)\n", outputBufferInt[0] );
               printf( "Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n", startIdx, endIdx, outputBegIdx, outputNbElement, fixSize );
               printf( "Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n", refOutBeg, refOutNbElement );
               TA_Free( outputBuffer );
               TA_Free( outputBufferInt );
               return TA_TESTUTIL_DRT_BAD_PREFIX;
            }

            if( outputBuffer[fixSize+1] != RESV_PATTERN_SUFFIX )
            {
               printf( "Fail: doRangeTestFixSize bad RESV_PATTERN_SUFFIX (%e)\n", outputBuffer[fixSize+1] );
               printf( "Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n", startIdx, endIdx, outputBegIdx, outputNbElement, fixSize );
               printf( "Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n", refOutBeg, refOutNbElement );
               TA_Free( outputBuffer );
               TA_Free( outputBufferInt );
               return TA_TESTUTIL_DRT_BAD_SUFFIX;
            }

            if( outputBufferInt[fixSize+1] != RESV_PATTERN_SUFFIX_INT )
            {
               printf( "Fail: doRangeTestFixSize bad RESV_PATTERN_SUFFIX_INT (%d)\n", outputBufferInt[fixSize+1] );
               printf( "Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n", startIdx, endIdx, outputBegIdx, outputNbElement, fixSize );
               printf( "Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n", refOutBeg, refOutNbElement );
               TA_Free( outputBuffer );
               TA_Free( outputBufferInt );
               return TA_TESTUTIL_DRT_BAD_SUFFIX;
            }

            /* Clean-up for next test. */
            if( outputIsInteger )
            {
               for( i=1; i <= fixSize; i++ )
                  outputBufferInt[i] = RESV_PATTERN_IMPROBABLE_INT;
            }
            else
            {
               for( i=1; i <= fixSize; i++ )
                  outputBuffer[i] = RESV_PATTERN_IMPROBABLE;
            }
         }

         /* Skip some startIdx at random. Limit case are still
          * tested though.
          */
         if( (startIdx > 30) && ((startIdx+100) <= (MAX_RANGE_SIZE-fixSize)) )
         {
            /* Randomly skips from 40 to 100 tests. */
            temp = (rand() % 100)+40;
            startIdx += temp;
         }
      }

      /* Loop and move forward for the next startIdx to test. */
   }

   TA_Free( outputBuffer );
   TA_Free( outputBufferInt );
   return TA_TEST_PASS;
}